

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O2

void __thiscall BuildTestDyndepReadySyntaxError::Run(BuildTestDyndepReadySyntaxError *this)

{
  int iVar1;
  Test *pTVar2;
  bool condition;
  Node *pNVar3;
  string err;
  allocator<char> local_62;
  allocator<char> local_61;
  string local_60;
  string local_40;
  
  iVar1 = g_current_test->assertion_failures_;
  AssertParse(&(this->super_BuildTest).super_StateTestWithBuiltinRules.state_,
              "rule touch\n  command = touch $out\nbuild out: touch || dd\n  dyndep = dd\n",
              (ManifestParserOptions)0x0);
  if (iVar1 == g_current_test->assertion_failures_) {
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"dd",&local_62);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"build out: dyndep\n",&local_61);
    VirtualFileSystem::Create(&(this->super_BuildTest).fs_,&local_60,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::__cxx11::string::~string((string *)&local_60);
    pTVar2 = g_current_test;
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    local_60._M_string_length = 0;
    local_60.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"out",&local_62);
    pNVar3 = Builder::AddTarget(&(this->super_BuildTest).builder_,&local_40,&local_60);
    testing::Test::Check
              (pTVar2,pNVar3 == (Node *)0x0,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbb4,"builder_.AddTarget(\"out\", &err)");
    std::__cxx11::string::~string((string *)&local_40);
    pTVar2 = g_current_test;
    condition = std::operator==("dd:1: expected \'ninja_dyndep_version = ...\'\n",&local_60);
    testing::Test::Check
              (pTVar2,condition,
               "/workspace/llm4binary/github/license_c_cmakelists/Kitware[P]ninja/src/build_test.cc"
               ,0xbb5,"\"dd:1: expected \'ninja_dyndep_version = ...\'\\n\" == err");
    std::__cxx11::string::~string((string *)&local_60);
  }
  else {
    g_current_test->assertion_failures_ = g_current_test->assertion_failures_ + 1;
  }
  return;
}

Assistant:

TEST_F(BuildTest, DyndepReadySyntaxError) {
  // Verify that a dyndep file can be loaded immediately to discover
  // and reject a syntax error in it.
  ASSERT_NO_FATAL_FAILURE(AssertParse(&state_,
"rule touch\n"
"  command = touch $out\n"
"build out: touch || dd\n"
"  dyndep = dd\n"
));
  fs_.Create("dd",
"build out: dyndep\n"
);

  string err;
  EXPECT_FALSE(builder_.AddTarget("out", &err));
  EXPECT_EQ("dd:1: expected 'ninja_dyndep_version = ...'\n", err);
}